

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

void __thiscall helics::CommonCore::processQueryCommand(CommonCore *this,ActionMessage *cmd)

{
  _Rb_tree_header *p_Var1;
  size_t __n;
  _Alloc_hider _Var2;
  size_type __n_00;
  short extraout_AX;
  int iVar3;
  int iVar4;
  BaseType BVar5;
  string *psVar6;
  mapped_type *pmVar7;
  FederateState *fed;
  uint *puVar8;
  _Base_ptr p_Var9;
  bool force_ordering;
  action_t aVar10;
  _Base_ptr p_Var11;
  pointer __s1;
  string_view federateName;
  string_view queryStr;
  string_view queryStr_00;
  string_view queryStr_01;
  string repStr;
  ActionMessage queryResp;
  string local_128;
  ActionMessage local_108;
  string local_50;
  
  aVar10 = cmd->messageAction;
  if (aVar10 < cmd_query_ordered) {
    if (aVar10 == cmd_query_reply) {
LAB_002fab68:
      iVar4 = (cmd->dest_id).gid;
      if (iVar4 == (this->super_BrokerBase).global_broker_id_local.gid || iVar4 == -0x396fe) {
        processQueryResponse(this,cmd);
        return;
      }
      p_Var11 = (this->routing_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      puVar8 = &parent_route_id;
      if (p_Var11 != (_Base_ptr)0x0) {
        p_Var1 = &(this->routing_table)._M_t._M_impl.super__Rb_tree_header;
        p_Var9 = &p_Var1->_M_header;
        do {
          if (iVar4 <= (int)p_Var11[1]._M_color) {
            p_Var9 = p_Var11;
          }
          p_Var11 = (&p_Var11->_M_left)[(int)p_Var11[1]._M_color < iVar4];
        } while (p_Var11 != (_Base_ptr)0x0);
        if ((_Rb_tree_header *)p_Var9 != p_Var1) {
          puVar8 = &parent_route_id;
          if ((int)p_Var9[1]._M_color <= iVar4) {
            puVar8 = (uint *)&p_Var9[1].field_0x4;
          }
        }
      }
      (*(this->super_Core)._vptr_Core[0x6b])(this,(ulong)*puVar8,cmd);
      return;
    }
    force_ordering = false;
    if (aVar10 == cmd_query) goto LAB_002faba1;
    if (aVar10 != cmd_broker_query) {
      return;
    }
  }
  else {
    if (aVar10 == cmd_query_ordered) {
      force_ordering = true;
LAB_002faba1:
      if ((cmd->dest_id).gid == 0) {
        if ((cmd->source_id).gid == -0x396fe) {
          if ((this->queryTimeouts).
              super__Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              (this->queryTimeouts).
              super__Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur) {
            BrokerBase::setTickForwarding(&this->super_BrokerBase,QUERY_TIMEOUT,true);
          }
          local_108._0_8_ = std::chrono::_V2::steady_clock::now();
          std::
          deque<std::pair<int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>>>
          ::
          emplace_back<int&,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                    ((deque<std::pair<int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>>>
                      *)&this->queryTimeouts,&cmd->messageID,
                     (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)&local_108);
        }
        psVar6 = ActionMessage::getString_abi_cxx11_(cmd,0);
        iVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          psVar6,"root");
        if ((iVar4 == 0) ||
           (iVar4 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               psVar6,"federation"), iVar4 == 0)) {
          aVar10 = cmd_broker_query;
          if (force_ordering != false) {
            aVar10 = cmd_broker_query_ordered;
          }
          ActionMessage::setAction(cmd,aVar10);
          BVar5 = 1;
        }
        else {
          iVar4 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             psVar6,"parent");
          if ((iVar4 != 0) &&
             (iVar4 = CLI::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)psVar6,"broker"), iVar4 != 0)) goto LAB_002faca6;
          aVar10 = cmd_broker_query;
          if (force_ordering != false) {
            aVar10 = cmd_broker_query_ordered;
          }
          ActionMessage::setAction(cmd,aVar10);
          BVar5 = (this->super_BrokerBase).higher_broker_id.gid;
        }
        (cmd->dest_id).gid = BVar5;
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase_at_end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&cmd->stringData,
                          (cmd->stringData).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
LAB_002faca6:
        iVar4 = (this->super_BrokerBase).global_broker_id_local.gid;
        if (iVar4 != 0) {
          (cmd->source_id).gid = iVar4;
          (*(this->super_Core)._vptr_Core[0x6c])(this,0,cmd);
          return;
        }
        (cmd->source_id).gid = -0x396fe;
        gmlc::containers::SimpleQueue<helics::ActionMessage,_std::mutex>::
        push<helics::ActionMessage>(&this->delayTransmitQueue,cmd);
        return;
      }
      local_128._M_string_length = 0;
      local_128.field_2._M_local_buf[0] = '\0';
      aVar10 = cmd_query_reply;
      if (force_ordering != false) {
        aVar10 = cmd_query_reply_ordered;
      }
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      ActionMessage::ActionMessage(&local_108,aVar10);
      local_108.dest_id.gid = (cmd->source_id).gid;
      local_108.source_id.gid = (cmd->dest_id).gid;
      local_108.messageID = cmd->messageID;
      local_108.counter = cmd->counter;
      psVar6 = ActionMessage::getString_abi_cxx11_(cmd,0);
      __n = psVar6->_M_string_length;
      if (__n == (this->super_BrokerBase).identifier._M_string_length) {
        if (__n != 0) {
          __s1 = (psVar6->_M_dataplus)._M_p;
          iVar4 = bcmp(__s1,(this->super_BrokerBase).identifier._M_dataplus._M_p,__n);
          if (iVar4 != 0) goto LAB_002fb045;
        }
        local_108.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
        queryStr_01._M_str = (char *)(cmd->payload).heap;
        queryStr_01._M_len = (cmd->payload).bufferSize;
        coreQuery_abi_cxx11_(&local_50,this,queryStr_01,force_ordering);
        processQueryCommand();
LAB_002fb0ae:
        __n_00 = local_128._M_string_length;
        _Var2._M_p = local_128._M_dataplus._M_p;
        if ((byte *)local_128._M_dataplus._M_p == local_108.payload.heap) {
          local_108.payload.bufferSize = local_128._M_string_length;
        }
        else {
          SmallBuffer::reserve(&local_108.payload,local_128._M_string_length);
          local_108.payload.bufferSize = __n_00;
          if (__n_00 != 0) {
            memcpy(local_108.payload.heap,_Var2._M_p,__n_00);
          }
        }
        if (local_108.dest_id.gid == -0x396fe) {
          processQueryResponse(this,&local_108);
        }
        else {
          p_Var11 = (this->routing_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          puVar8 = &parent_route_id;
          if (p_Var11 != (_Base_ptr)0x0) {
            p_Var1 = &(this->routing_table)._M_t._M_impl.super__Rb_tree_header;
            p_Var9 = &p_Var1->_M_header;
            do {
              if (local_108.dest_id.gid <= (int)p_Var11[1]._M_color) {
                p_Var9 = p_Var11;
              }
              p_Var11 = (&p_Var11->_M_left)[(int)p_Var11[1]._M_color < local_108.dest_id.gid];
            } while (p_Var11 != (_Base_ptr)0x0);
            if ((_Rb_tree_header *)p_Var9 != p_Var1) {
              puVar8 = &parent_route_id;
              if ((int)p_Var9[1]._M_color <= local_108.dest_id.gid) {
                puVar8 = (uint *)&p_Var9[1].field_0x4;
              }
            }
          }
          (*(this->super_Core)._vptr_Core[0x6b])(this,(ulong)*puVar8,&local_108);
        }
      }
      else {
        __s1 = (psVar6->_M_dataplus)._M_p;
LAB_002fb045:
        federateName._M_str = __s1;
        federateName._M_len = __n;
        fed = getFederateCore(this,federateName);
        queryStr._M_str = (char *)(cmd->payload).heap;
        queryStr._M_len = (cmd->payload).bufferSize;
        federateQuery_abi_cxx11_(&local_50,this,fed,queryStr,force_ordering);
        processQueryCommand();
        if (extraout_AX == 0) goto LAB_002fb0ae;
        if (extraout_AX == 1) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_128,
                    "#error");
          goto LAB_002fb0ae;
        }
        (cmd->dest_id).gid = (fed->global_id)._M_i.gid;
        FederateState::addAction(fed,cmd);
      }
      ActionMessage::~ActionMessage(&local_108);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p == &local_128.field_2) {
        return;
      }
      goto LAB_002fb023;
    }
    if (aVar10 == cmd_query_reply_ordered) goto LAB_002fab68;
    if (aVar10 != cmd_broker_query_ordered) {
      return;
    }
    force_ordering = true;
  }
  iVar4 = (cmd->dest_id).gid;
  if (iVar4 != (this->super_BrokerBase).global_broker_id_local.gid && iVar4 != -0x396fe) {
    routeMessage(this,cmd);
    return;
  }
  queryStr_00._M_str = (char *)(cmd->payload).heap;
  queryStr_00._M_len = (cmd->payload).bufferSize;
  coreQuery_abi_cxx11_(&local_128,this,queryStr_00,force_ordering);
  iVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_128,
                  "#wait");
  iVar4 = (cmd->source_id).gid;
  if (iVar3 == 0) {
    if (iVar4 == -0x396fe) {
      if ((this->queryTimeouts).
          super__Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          (this->queryTimeouts).
          super__Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur) {
        BrokerBase::setTickForwarding(&this->super_BrokerBase,QUERY_TIMEOUT,true);
      }
      local_108._0_8_ = std::chrono::_V2::steady_clock::now();
      std::
      deque<std::pair<int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>>>
      ::
      emplace_back<int&,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                ((deque<std::pair<int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>>>
                  *)&this->queryTimeouts,&cmd->messageID,
                 (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  *)&local_108);
    }
    aVar10 = cmd_query_reply;
    if (force_ordering != false) {
      aVar10 = cmd_query_reply_ordered;
    }
    ActionMessage::ActionMessage(&local_108,aVar10);
    local_108.dest_id.gid = (cmd->source_id).gid;
    local_108.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
    local_108.messageID = cmd->messageID;
    local_108.counter = cmd->counter;
    local_50._M_dataplus._M_p = (pointer)(cmd->payload).bufferSize;
    local_50._M_string_length = (size_type)(cmd->payload).heap;
    pmVar7 = std::
             map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>_>_>_>
             ::at((map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>_>_>_>
                   *)mapIndex,(key_type *)&local_50);
    std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::push_back
              ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
               ((long)&(((this->mapBuilders).
                         super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                       ).
                       super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                       .
                       super__Head_base<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_false>
                       ._M_head_impl.
                       super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>
                       ._M_impl.super__Vector_impl_data._M_start +
               (ulong)((uint)pmVar7->first * 0x60)),&local_108);
LAB_002fb00b:
    ActionMessage::~ActionMessage(&local_108);
  }
  else {
    if (iVar4 != -0x396fe) {
      aVar10 = cmd_query_reply;
      if (force_ordering != false) {
        aVar10 = cmd_query_reply_ordered;
      }
      ActionMessage::ActionMessage(&local_108,aVar10);
      local_108.payload.bufferSize = local_128._M_string_length;
      _Var2._M_p = local_128._M_dataplus._M_p;
      local_108.dest_id.gid = (cmd->source_id).gid;
      local_108.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
      local_108.messageID = cmd->messageID;
      if ((byte *)local_128._M_dataplus._M_p == local_108.payload.heap) {
      }
      else {
        SmallBuffer::reserve(&local_108.payload,local_128._M_string_length);
        if (local_108.payload.bufferSize != 0) {
          memcpy(local_108.payload.heap,_Var2._M_p,local_108.payload.bufferSize);
        }
      }
      local_108.counter = cmd->counter;
      p_Var11 = (this->routing_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      puVar8 = &parent_route_id;
      if (p_Var11 != (_Base_ptr)0x0) {
        p_Var1 = &(this->routing_table)._M_t._M_impl.super__Rb_tree_header;
        p_Var9 = &p_Var1->_M_header;
        do {
          if (local_108.dest_id.gid <= (int)p_Var11[1]._M_color) {
            p_Var9 = p_Var11;
          }
          p_Var11 = (&p_Var11->_M_left)[(int)p_Var11[1]._M_color < local_108.dest_id.gid];
        } while (p_Var11 != (_Base_ptr)0x0);
        if ((_Rb_tree_header *)p_Var9 != p_Var1) {
          puVar8 = &parent_route_id;
          if ((int)p_Var9[1]._M_color <= local_108.dest_id.gid) {
            puVar8 = (uint *)&p_Var9[1].field_0x4;
          }
        }
      }
      (*(this->super_Core)._vptr_Core[0x6b])(this,(ulong)*puVar8,&local_108);
      goto LAB_002fb00b;
    }
    gmlc::concurrency::
    DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::setDelayedValue(&this->activeQueries,cmd->messageID,&local_128);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p == &local_128.field_2) {
    return;
  }
LAB_002fb023:
  operator_delete(local_128._M_dataplus._M_p,
                  CONCAT71(local_128.field_2._M_allocated_capacity._1_7_,
                           local_128.field_2._M_local_buf[0]) + 1);
  return;
}

Assistant:

void CommonCore::processQueryCommand(ActionMessage& cmd)
{
    bool force_ordered{false};
    switch (cmd.action()) {
        case CMD_BROKER_QUERY_ORDERED:
            force_ordered = true;
            [[fallthrough]];
        case CMD_BROKER_QUERY:

            if (cmd.dest_id == global_broker_id_local || cmd.dest_id == gDirectCoreId) {
                std::string repStr = coreQuery(cmd.payload.to_string(), force_ordered);
                if (repStr != "#wait") {
                    if (cmd.source_id == gDirectCoreId) {
                        activeQueries.setDelayedValue(cmd.messageID, std::move(repStr));
                    } else {
                        ActionMessage queryResp(force_ordered ? CMD_QUERY_REPLY_ORDERED :
                                                                CMD_QUERY_REPLY);
                        queryResp.dest_id = cmd.source_id;
                        queryResp.source_id = global_broker_id_local;
                        queryResp.messageID = cmd.messageID;
                        queryResp.payload = std::move(repStr);
                        queryResp.counter = cmd.counter;
                        transmit(getRoute(queryResp.dest_id), queryResp);
                    }
                } else {
                    if (cmd.source_id == gDirectCoreId) {
                        if (queryTimeouts.empty()) {
                            setTickForwarding(TickForwardingReasons::QUERY_TIMEOUT, true);
                        }
                        queryTimeouts.emplace_back(cmd.messageID, std::chrono::steady_clock::now());
                    }
                    ActionMessage queryResp(force_ordered ? CMD_QUERY_REPLY_ORDERED :
                                                            CMD_QUERY_REPLY);
                    queryResp.dest_id = cmd.source_id;
                    queryResp.source_id = global_broker_id_local;
                    queryResp.messageID = cmd.messageID;
                    queryResp.counter = cmd.counter;
                    std::get<1>(mapBuilders[mapIndex.at(cmd.payload.to_string()).first])
                        .push_back(queryResp);
                }

            } else {
                routeMessage(std::move(cmd));
            }
            break;
        case CMD_QUERY_ORDERED:
            force_ordered = true;
            [[fallthrough]];
        case CMD_QUERY:
            if (cmd.dest_id == parent_broker_id) {
                if (cmd.source_id == gDirectCoreId) {
                    if (queryTimeouts.empty()) {
                        setTickForwarding(TickForwardingReasons::QUERY_TIMEOUT, true);
                    }
                    queryTimeouts.emplace_back(cmd.messageID, std::chrono::steady_clock::now());
                }
                const auto& target = cmd.getString(targetStringLoc);
                if (target == "root" || target == "federation") {
                    cmd.setAction(force_ordered ? CMD_BROKER_QUERY_ORDERED : CMD_BROKER_QUERY);
                    cmd.dest_id = gRootBrokerID;
                    cmd.clearStringData();
                } else if (target == "parent" || target == "broker") {
                    cmd.setAction(force_ordered ? CMD_BROKER_QUERY_ORDERED : CMD_BROKER_QUERY);
                    cmd.dest_id = higher_broker_id;
                    cmd.clearStringData();
                }
                if (global_broker_id_local != parent_broker_id) {
                    // forward on to Broker
                    cmd.source_id = global_broker_id_local;
                    transmit(parent_route_id, std::move(cmd));
                } else {
                    // this will get processed when this core is assigned a global hid
                    cmd.source_id = gDirectCoreId;
                    delayTransmitQueue.push(std::move(cmd));
                }
            } else {
                std::string repStr;
                ActionMessage queryResp(force_ordered ? CMD_QUERY_REPLY_ORDERED : CMD_QUERY_REPLY);
                queryResp.dest_id = cmd.source_id;
                queryResp.source_id = cmd.dest_id;
                queryResp.messageID = cmd.messageID;
                queryResp.counter = cmd.counter;
                const std::string& target = cmd.getString(targetStringLoc);
                if (target == getIdentifier()) {
                    queryResp.source_id = global_broker_id_local;
                    repStr = coreQuery(cmd.payload.to_string(), force_ordered);
                } else {
                    auto* fedptr = getFederateCore(target);
                    repStr = federateQuery(fedptr, cmd.payload.to_string(), force_ordered);
                    if (repStr == "#wait") {
                        if (fedptr != nullptr) {
                            cmd.dest_id = fedptr->global_id;
                            fedptr->addAction(std::move(cmd));
                            break;
                        }
                        repStr = "#error";
                    }
                }

                queryResp.payload = std::move(repStr);
                if (queryResp.dest_id == gDirectCoreId) {
                    processQueryResponse(queryResp);
                } else {
                    transmit(getRoute(queryResp.dest_id), queryResp);
                }
            }
            break;
        case CMD_QUERY_REPLY:
        case CMD_QUERY_REPLY_ORDERED:
            if (cmd.dest_id == global_broker_id_local || cmd.dest_id == gDirectCoreId) {
                processQueryResponse(cmd);
            } else {
                transmit(getRoute(cmd.dest_id), cmd);
            }
            break;
        default:
            break;
    }
}